

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QCss::AttributeSelector>::moveAppend
          (QGenericArrayOps<QCss::AttributeSelector> *this,AttributeSelector *b,AttributeSelector *e
          )

{
  qsizetype *pqVar1;
  AttributeSelector *pAVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pAVar2 = (this->super_QArrayDataPointer<QCss::AttributeSelector>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QCss::AttributeSelector>).size;
      pDVar4 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pAVar2[lVar3].name.d.d = pDVar4;
      pcVar5 = (b->name).d.ptr;
      (b->name).d.ptr = (char16_t *)0x0;
      pAVar2[lVar3].name.d.ptr = pcVar5;
      qVar6 = (b->name).d.size;
      (b->name).d.size = 0;
      pAVar2[lVar3].name.d.size = qVar6;
      pDVar4 = (b->value).d.d;
      (b->value).d.d = (Data *)0x0;
      pAVar2[lVar3].value.d.d = pDVar4;
      pcVar5 = (b->value).d.ptr;
      (b->value).d.ptr = (char16_t *)0x0;
      pAVar2[lVar3].value.d.ptr = pcVar5;
      qVar6 = (b->value).d.size;
      (b->value).d.size = 0;
      pAVar2[lVar3].value.d.size = qVar6;
      pAVar2[lVar3].valueMatchCriterium = b->valueMatchCriterium;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QCss::AttributeSelector>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }